

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frobtadsappcurses.cc
# Opt level: O3

void __thiscall
FrobTadsApplicationCurses::clear
          (FrobTadsApplicationCurses *this,int top,int left,int bottom,int right,int attrs)

{
  int x;
  bool bVar1;
  
  if (top <= bottom) {
    do {
      x = left;
      if (left <= right) {
        do {
          FrobTadsWindow::printChar
                    ((this->fGameWindow)._M_t.
                     super___uniq_ptr_impl<FrobTadsWindow,_std::default_delete<FrobTadsWindow>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_FrobTadsWindow_*,_std::default_delete<FrobTadsWindow>_>.
                     super__Head_base<0UL,_FrobTadsWindow_*,_false>._M_head_impl,top,x,attrs | 0x20)
          ;
          x = x + 1;
        } while (right + 1 != x);
      }
      bVar1 = top != bottom;
      top = top + 1;
    } while (bVar1);
  }
  return;
}

Assistant:

void
FrobTadsApplicationCurses::clear( int top, int left, int bottom, int right, int attrs )
{
    const chtype c = attrs | ' ';
    for (int y = top; y <= bottom; ++y) {
        for (int x = left; x <= right; ++x) {
            this->fGameWindow->printChar(y, x, c);
        }
    }
}